

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  DataKey DVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  pointer pnVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_184;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> *local_138;
  pointer local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (pSVar3->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  lVar16 = (long)(pSVar3->infeasibilitiesCo).super_IdxSet.num;
  local_138 = &best->m_backend;
  if (lVar16 < 1) {
    local_184 = -1;
  }
  else {
    local_f0 = &this->last;
    lVar16 = lVar16 + 1;
    local_184 = -1;
    do {
      iVar2 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[lVar16 + -2];
      local_178.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
      local_178.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_178.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_178.exp = pnVar4[iVar2].m_backend.exp;
      local_178.neg = pnVar4[iVar2].m_backend.neg;
      local_178.fpclass = pnVar4[iVar2].m_backend.fpclass;
      local_178.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
      local_128.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.exp = (feastol->m_backend).exp;
      local_128.neg = (feastol->m_backend).neg;
      local_128.fpclass = (feastol->m_backend).fpclass;
      local_128.prec_elem = (feastol->m_backend).prec_elem;
      if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
        local_128.neg = (bool)(local_128.neg ^ 1);
      }
      if ((local_128.fpclass == cpp_dec_float_NaN || local_178.fpclass == cpp_dec_float_NaN) ||
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_178,&local_128), -1 < iVar13)) {
        pSVar3 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar5 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
        iVar13 = (pSVar3->infeasibilitiesCo).super_IdxSet.num;
        (pSVar3->infeasibilitiesCo).super_IdxSet.num = iVar13 + -1;
        piVar5[lVar16 + -2] = piVar5[(long)iVar13 + -1];
        (pSVar3->isInfeasibleCo).data[iVar2] = 0;
        uVar11 = local_178.data._M_elems._16_8_;
        uVar6 = local_178.data._M_elems._32_8_;
        uVar12 = local_178._48_8_;
      }
      else {
        uStack_50 = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
        local_68 = (devexpr  [8])local_178.data._M_elems._0_8_;
        auStack_60[0] = local_178.data._M_elems[2];
        auStack_60[1] = local_178.data._M_elems[3];
        local_58[0] = local_178.data._M_elems[4];
        local_58[1] = local_178.data._M_elems[5];
        local_48[0] = local_178.data._M_elems[8];
        local_48[1] = local_178.data._M_elems[9];
        local_40 = local_178.exp;
        local_3c = local_178.neg;
        local_38 = local_178.fpclass;
        iStack_34 = local_178.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_130[iVar2].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_130[iVar2].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_130[iVar2].m_backend.exp;
        local_a8.m_backend.neg = local_130[iVar2].m_backend.neg;
        local_a8.m_backend.fpclass = local_130[iVar2].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_130[iVar2].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_128,local_68,&local_a8,&local_e8,in_R8);
        uVar6._0_4_ = local_128.data._M_elems[8];
        uVar6._4_4_ = local_128.data._M_elems[9];
        local_178.data._M_elems[8] = local_128.data._M_elems[8];
        local_178.data._M_elems[9] = local_128.data._M_elems[9];
        uVar11._0_4_ = local_128.data._M_elems[4];
        uVar11._4_4_ = local_128.data._M_elems[5];
        local_178.data._M_elems[4] = local_128.data._M_elems[4];
        local_178.data._M_elems[5] = local_128.data._M_elems[5];
        local_178.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
        local_178.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
        local_178.data._M_elems[0] = local_128.data._M_elems[0];
        local_178.data._M_elems[1] = local_128.data._M_elems[1];
        local_178.data._M_elems[2] = local_128.data._M_elems[2];
        local_178.data._M_elems[3] = local_128.data._M_elems[3];
        local_178.exp = local_128.exp;
        local_178.neg = local_128.neg;
        uVar12._0_4_ = local_128.fpclass;
        uVar12._4_4_ = local_128.prec_elem;
        local_178.fpclass = local_128.fpclass;
        local_178.prec_elem = local_128.prec_elem;
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_138->fpclass != cpp_dec_float_NaN))
           && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,local_138), uVar11 = local_178.data._M_elems._16_8_,
              uVar6 = local_178.data._M_elems._32_8_, uVar12 = local_178._48_8_, 0 < iVar13)) {
          pnVar15 = local_130 + iVar2;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 8)
               = local_178.data._M_elems._32_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 4)
               = local_178.data._M_elems._16_8_;
          *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 6) =
               CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems =
               local_178.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 2)
               = local_178.data._M_elems._8_8_;
          local_138->exp = local_178.exp;
          local_138->neg = local_178.neg;
          local_138->fpclass = local_178.fpclass;
          local_138->prec_elem = local_178.prec_elem;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 8) =
               *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x20);
          uVar7 = *(undefined8 *)&(pnVar15->m_backend).data;
          uVar8 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 8);
          uVar9 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x18);
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 4) =
               *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x10);
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 6) = uVar9;
          *(undefined8 *)(local_f0->m_backend).data._M_elems = uVar7;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 2) = uVar8;
          (this->last).m_backend.exp = (pnVar15->m_backend).exp;
          (this->last).m_backend.neg = (pnVar15->m_backend).neg;
          iVar10 = (pnVar15->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar15->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar10;
          local_184 = iVar2;
        }
      }
      local_178._48_8_ = uVar12;
      local_178.data._M_elems._32_8_ = uVar6;
      local_178.data._M_elems._16_8_ = uVar11;
      lVar16 = lVar16 + -1;
    } while (1 < lVar16);
  }
  if (local_184 < 0) {
    DVar14.info = 0;
    DVar14.idx = -1;
  }
  else {
    DVar14 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,local_184);
  }
  return (SPxId)DVar14;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}